

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Input::endBitSetScalar(Input *this)

{
  ulong uVar1;
  HNode *pHVar2;
  _Bit_type *p_Var3;
  Node *pNVar4;
  uint uVar5;
  ulong uVar6;
  Twine local_38;
  
  if ((this->EC)._M_value == 0) {
    pHVar2 = this->CurrentNode;
    if (pHVar2 == (HNode *)0x0) {
      __assert_fail("Val && \"isa<> used on a null pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                    ,0x69,
                    "static bool llvm::isa_impl_cl<llvm::yaml::Input::SequenceHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::SequenceHNode, From = const llvm::yaml::Input::HNode *]"
                   );
    }
    if (pHVar2->_node->TypeID == 5) {
      p_Var3 = (this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar1 = (ulong)(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3
              ) * 8;
      pNVar4 = (Node *)pHVar2[1]._vptr_HNode;
      if (uVar1 != (long)pHVar2[1]._node - (long)pNVar4 >> 3) {
        __assert_fail("BitValuesUsed.size() == SQ->Entries.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                      ,0x147,"virtual void llvm::yaml::Input::endBitSetScalar()");
      }
      if (pHVar2[1]._node != pNVar4) {
        uVar5 = 1;
        uVar6 = 0;
        do {
          if ((p_Var3[uVar5 - 1 >> 6] >> (uVar6 & 0x3f) & 1) == 0) {
            pHVar2 = (HNode *)(&pNVar4->_vptr_Node)[uVar6];
            Twine::Twine(&local_38,"unknown bit value");
            setError(this,pHVar2,&local_38);
            return;
          }
          uVar6 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar6 < uVar1);
      }
    }
  }
  return;
}

Assistant:

void Input::endBitSetScalar() {
  if (EC)
    return;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    assert(BitValuesUsed.size() == SQ->Entries.size());
    for (unsigned i = 0; i < SQ->Entries.size(); ++i) {
      if (!BitValuesUsed[i]) {
        setError(SQ->Entries[i].get(), "unknown bit value");
        return;
      }
    }
  }
}